

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O0

void agc_max(agc_t *agc,mfcc_t **mfc,int32 n_frame)

{
  int local_20;
  int32 i;
  int32 n_frame_local;
  mfcc_t **mfc_local;
  agc_t *agc_local;
  
  if (0 < n_frame) {
    agc->obs_max = **mfc;
    for (local_20 = 1; local_20 < n_frame; local_20 = local_20 + 1) {
      if ((float)agc->obs_max <= (float)*mfc[local_20] &&
          (float)*mfc[local_20] != (float)agc->obs_max) {
        agc->obs_max = *mfc[local_20];
        agc->obs_frame = 1;
      }
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/agc.c"
            ,0x7b,"AGCMax: obs=max= %.2f\n",(double)(float)agc->obs_max);
    for (local_20 = 0; local_20 < n_frame; local_20 = local_20 + 1) {
      *mfc[local_20] = (mfcc_t)((float)*mfc[local_20] - (float)agc->obs_max);
    }
  }
  return;
}

Assistant:

void
agc_max(agc_t *agc, mfcc_t **mfc, int32 n_frame)
{
    int32 i;

    if (n_frame <= 0)
        return;
    agc->obs_max = mfc[0][0];
    for (i = 1; i < n_frame; i++) {
        if (mfc[i][0] > agc->obs_max) {
            agc->obs_max = mfc[i][0];
            agc->obs_frame = 1;
        }
    }

    E_INFO("AGCMax: obs=max= %.2f\n", agc->obs_max);
    for (i = 0; i < n_frame; i++)
        mfc[i][0] -= agc->obs_max;
}